

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.c
# Opt level: O0

void add_data(int pass,char c)

{
  int in_EDI;
  
  if (root == (section_t *)0x0) {
    err(F,"code generation before a section has been created");
  }
  if (in_EDI == 1) {
    cur->pc = cur->pc + 1;
    cur->datasize = cur->datasize + 1;
  }
  else {
    write_byte('\0');
    cur->pc = cur->pc + 1;
  }
  return;
}

Assistant:

void add_data(int pass, char c)
{
    if (root == NULL)
        err(F, "code generation before a section has been created");

    if (pass == READ_PASS)
    {
        cur->pc++;
        cur->datasize++;
    }
    else
    {
        write_byte(c);
        cur->pc++;
    }
}